

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clearerr.c
# Opt level: O3

int main(void)

{
  byte *pbVar1;
  int iVar2;
  FILE *pFVar3;
  
  pFVar3 = tmpfile();
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x19,"( fh = tmpfile() ) != NULL");
  }
  iVar2 = ferror(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1b,"! ferror( fh )");
  }
  iVar2 = feof(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1c,"! feof( fh )");
  }
  rewind(pFVar3);
  iVar2 = fgetc(pFVar3);
  if (iVar2 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1f,"fgetc( fh ) == EOF");
  }
  iVar2 = ferror(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x20,"! ferror( fh )");
  }
  iVar2 = feof(pFVar3);
  if (iVar2 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x21,"feof( fh )");
  }
  pbVar1 = (byte *)((long)&pFVar3->_IO_buf_end + 5);
  *pbVar1 = *pbVar1 & 0xf9;
  iVar2 = ferror(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x24,"! ferror( fh )");
  }
  iVar2 = feof(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x25,"! feof( fh )");
  }
  pFVar3 = freopen((char *)0x0,"w",pFVar3);
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x28,"( fh = freopen( NULL, \"w\", fh ) ) != NULL");
  }
  iVar2 = fgetc(pFVar3);
  if (iVar2 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2a,"fgetc( fh ) == EOF");
  }
  iVar2 = ferror(pFVar3);
  if (iVar2 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2b,"ferror( fh )");
  }
  iVar2 = feof(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2c,"! feof( fh )");
  }
  pbVar1 = (byte *)((long)&pFVar3->_IO_buf_end + 5);
  *pbVar1 = *pbVar1 & 0xf9;
  iVar2 = ferror(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x30,"! ferror( fh )");
  }
  iVar2 = feof(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x31,"! feof( fh )");
  }
  iVar2 = fclose(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x32,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
    TESTCASE( ( fh = tmpfile() ) != NULL );
    /* Flags should be clear */
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
    /* Reading from empty stream - should provoke EOF */
    rewind( fh );
    TESTCASE( fgetc( fh ) == EOF );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( feof( fh ) );
    /* clearerr() should clear flags */
    clearerr( fh );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
#ifndef __ANDROID__
    /* reopen() the file write-only -- this fails on Termix */
    TESTCASE( ( fh = freopen( NULL, "w", fh ) ) != NULL );
    /* Reading from write-only stream - should provoke error */
    TESTCASE( fgetc( fh ) == EOF );
    TESTCASE( ferror( fh ) );
    TESTCASE( ! feof( fh ) );
#endif
    /* clearerr() should clear flags */
    clearerr( fh );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
    TESTCASE( fclose( fh ) == 0 );
    return TEST_RESULTS;
}